

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void SQCompilation::StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm)

{
  undefined8 uVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  iterator iVar4;
  iterator iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  ulong uVar8;
  long lVar9;
  string message;
  string local_60;
  SQCOMPILERERROR local_40;
  HSQUIRRELVM local_38;
  
  local_40 = vm->_sharedstate->_compilererrorhandler;
  if (local_40 != (SQCOMPILERERROR)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    p_Var3 = (_Rb_tree_node_base *)declaredGlobals_abi_cxx11_._24_8_;
    local_38 = vm;
    p_Var6 = (_Rb_tree_node_base *)usedGlobals_abi_cxx11_._24_8_;
    if (declaredGlobals_abi_cxx11_._24_8_ != 0x1ab1d0) {
      do {
        if (((long)p_Var3[2]._M_parent - *(long *)(p_Var3 + 2) != 0x18) &&
           (p_Var7 = *(_Base_ptr *)(p_Var3 + 2), p_Var3[2]._M_parent != p_Var7)) {
          uVar1 = *(undefined8 *)(p_Var3 + 1);
          lVar9 = 0x10;
          uVar8 = 0;
          do {
            if (*(char *)((long)&p_Var7->_M_color + lVar9) == '\0') {
              local_60._M_string_length = 0;
              *local_60._M_dataplus._M_p = '\0';
              SQCompilationContext::renderDiagnosticHeader(DI_GLOBAL_NAME_REDEF,&local_60,uVar1);
              (*local_40)(local_38,SEV_WARNING,local_60._M_dataplus._M_p,
                          *(SQChar **)((long)p_Var7 + lVar9 + -0x10),
                          (long)*(int *)((long)p_Var7 + lVar9 + -8),
                          (long)*(int *)((long)p_Var7 + lVar9 + -4),"\n");
            }
            uVar8 = uVar8 + 1;
            p_Var7 = *(_Base_ptr *)(p_Var3 + 2);
            uVar2 = ((long)p_Var3[2]._M_parent - (long)p_Var7 >> 3) * -0x5555555555555555;
            lVar9 = lVar9 + 0x18;
          } while (uVar8 <= uVar2 && uVar2 - uVar8 != 0);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        p_Var6 = (_Rb_tree_node_base *)usedGlobals_abi_cxx11_._24_8_;
      } while (p_Var3 != (_Rb_tree_node_base *)(declaredGlobals_abi_cxx11_ + 8));
    }
    for (; p_Var6 != (_Rb_tree_node_base *)(usedGlobals_abi_cxx11_ + 8);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      p_Var3 = p_Var6 + 1;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)knownBindings_abi_cxx11_,(key_type *)p_Var3);
      if (((iVar4.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) &&
          (iVar5 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                           *)declaredGlobals_abi_cxx11_,(key_type *)p_Var3),
          iVar5._M_node == (_Base_ptr)(declaredGlobals_abi_cxx11_ + 8))) &&
         (p_Var7 = *(_Base_ptr *)(p_Var6 + 2), p_Var6[2]._M_parent != p_Var7)) {
        lVar9 = 0x10;
        uVar8 = 0;
        do {
          if (*(char *)((long)&p_Var7->_M_color + lVar9) == '\0') {
            local_60._M_string_length = 0;
            *local_60._M_dataplus._M_p = '\0';
            SQCompilationContext::renderDiagnosticHeader
                      (DI_UNDEFINED_GLOBAL,&local_60,*(undefined8 *)p_Var3);
            (*local_40)(local_38,SEV_WARNING,local_60._M_dataplus._M_p,
                        *(SQChar **)((long)p_Var7 + lVar9 + -0x10),
                        (long)*(int *)((long)p_Var7 + lVar9 + -8),
                        (long)*(int *)((long)p_Var7 + lVar9 + -4),"\n");
          }
          uVar8 = uVar8 + 1;
          p_Var7 = *(_Base_ptr *)(p_Var6 + 2);
          uVar2 = ((long)p_Var6[2]._M_parent - (long)p_Var7 >> 3) * -0x5555555555555555;
          lVar9 = lVar9 + 0x18;
        } while (uVar8 <= uVar2 && uVar2 - uVar8 != 0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm) {
  auto errorFunc = _ss(vm)->_compilererrorhandler;

  if (!errorFunc)
    return;

  // 1. Check multiple declarations

  std::string message;

  for (auto it = declaredGlobals.begin(); it != declaredGlobals.end(); ++it) {
    const SQChar *name = it->first.c_str();
    const auto &declarations = it->second;

    if (declarations.size() == 1)
      continue;

    for (int32_t i = 0; i < declarations.size(); ++i) {
      const IdLocation &loc = declarations[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_GLOBAL_NAME_REDEF, &message, name);
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }

  // 2. Check undefined usages

  for (auto it = usedGlobals.begin(); it != usedGlobals.end(); ++it) {
    const std::string &id = it->first;

    bool isKnownBinding = knownBindings.find(id) != knownBindings.end();
    if (isKnownBinding)
      continue;

    if (declaredGlobals.find(id) != declaredGlobals.end())
      continue;

    const auto &usages = it->second;

    for (int32_t i = 0; i < usages.size(); ++i) {
      const IdLocation &loc = usages[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_UNDEFINED_GLOBAL, &message, id.c_str());
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }
}